

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::CJoint::Prepare(CJoint *this,btScalar dt,int iterations)

{
  int iVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  Body::activate((this->super_Joint).m_bodies);
  Body::activate((this->super_Joint).m_bodies + 1);
  iVar1 = this->m_life;
  (this->super_Joint).m_delete = this->m_maxlife <= iVar1;
  this->m_life = iVar1 + 1;
  if (iVar1 == 0) {
    fVar7 = (this->super_Joint).m_erp;
    fVar6 = (this->super_Joint).m_split;
    fVar3 = 1.0 / dt;
    fVar4 = fVar3 * fVar7 * (this->super_Joint).m_drift.m_floats[0];
    fVar5 = fVar3 * (this->super_Joint).m_drift.m_floats[1] * fVar7;
    fVar3 = fVar3 * fVar7 * (this->super_Joint).m_drift.m_floats[2];
    *(ulong *)((this->super_Joint).m_drift.m_floats + 2) = (ulong)(uint)fVar3;
    if (0.0 < fVar6) {
      fVar7 = fVar6 * fVar4;
      fVar9 = fVar5 * fVar6;
      fVar8 = fVar6 * fVar3;
      auVar2._4_4_ = fVar8 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] +
                     fVar7 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] +
                     (this->super_Joint).m_massmatrix.m_el[1].m_floats[1] * fVar9;
      auVar2._0_4_ = fVar8 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[2] +
                     fVar7 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] +
                     (this->super_Joint).m_massmatrix.m_el[0].m_floats[1] * fVar9;
      auVar2._8_4_ = fVar8 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[2] +
                     fVar7 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] +
                     fVar9 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[1];
      auVar2._12_4_ = 0;
      *(undefined1 (*) [16])(this->super_Joint).m_sdrift.m_floats = auVar2;
      fVar6 = 1.0 - fVar6;
      fVar3 = fVar3 * fVar6;
      fVar4 = fVar4 * fVar6;
      fVar5 = fVar5 * fVar6;
    }
    fVar7 = 1.0 / (float)iterations;
    *(ulong *)(this->super_Joint).m_drift.m_floats = CONCAT44(fVar7 * fVar5,fVar7 * fVar4);
    (this->super_Joint).m_drift.m_floats[2] = fVar7 * fVar3;
  }
  else {
    (this->super_Joint).m_sdrift.m_floats[0] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[1] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[2] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[3] = 0.0;
    (this->super_Joint).m_drift.m_floats[0] = 0.0;
    (this->super_Joint).m_drift.m_floats[1] = 0.0;
    (this->super_Joint).m_drift.m_floats[2] = 0.0;
    (this->super_Joint).m_drift.m_floats[3] = 0.0;
  }
  return;
}

Assistant:

void				btSoftBody::CJoint::Prepare(btScalar dt,int iterations)
{
	Joint::Prepare(dt,iterations);
	const bool	dodrift=(m_life==0);
	m_delete=(++m_life)>m_maxlife;
	if(dodrift)
	{
		m_drift=m_drift*m_erp/dt;
		if(m_split>0)
		{
			m_sdrift	=	m_massmatrix*(m_drift*m_split);
			m_drift		*=	1-m_split;
		}
		m_drift/=(btScalar)iterations;
	}
	else
	{
		m_drift=m_sdrift=btVector3(0,0,0);
	}
}